

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.c
# Opt level: O2

nh_drawing_info * nh_get_drawing_info(void)

{
  char cVar1;
  int iVar2;
  nh_drawing_info *pnVar3;
  nh_symdef *pnVar4;
  size_t sVar5;
  char *__s;
  char **ppcVar6;
  char *pcVar7;
  ushort *puVar8;
  int *piVar9;
  long lVar10;
  ulong *puVar11;
  permonst *ppVar12;
  ulong local_98;
  undefined6 uStack_90;
  undefined2 uStack_8a;
  undefined6 uStack_88;
  char buffer [41];
  
  pnVar3 = (nh_drawing_info *)xmalloc(0x90);
  pnVar3->num_bgelements = 0x30;
  pnVar3->bgelements = defsyms;
  pnVar3->num_traps = 0x18;
  pnVar3->num_objects = 0x21a;
  pnVar3->traps = trapsyms;
  pnVar4 = (nh_symdef *)xmalloc(0x3270);
  ppcVar6 = &obj_descr[0].oc_descr;
  puVar8 = (ushort *)&const_objects[0].field_0x11;
  piVar9 = &pnVar4->color;
  lVar10 = 0;
  do {
    if (pnVar3->num_objects <= lVar10) {
      pnVar4[0x214].ch = '0';
      pnVar3->objects = pnVar4;
      pnVar4 = (nh_symdef *)xmalloc(0x18);
      pnVar4->ch = 'I';
      pnVar4->color = 8;
      pnVar4->symname = "invisible monster";
      pnVar3->invis = pnVar4;
      pnVar3->num_monsters = 0x193;
      pnVar4 = (nh_symdef *)xmalloc(0x25c8);
      piVar9 = &pnVar4->color;
      ppVar12 = mons;
      for (lVar10 = 0; lVar10 < pnVar3->num_monsters; lVar10 = lVar10 + 1) {
        cVar1 = ppVar12->mlet;
        ((nh_symdef *)(piVar9 + -4))->ch = ""[cVar1];
        pcVar7 = ppVar12->mname;
        __s = pcVar7;
        if (((long)cVar1 == 0x35) && (iVar2 = strncmp(pcVar7,"were",4), iVar2 == 0)) {
          sVar5 = strlen(pcVar7);
          __s = (char *)xmalloc((int)sVar5 + 7);
          sprintf(__s,"human %s",pcVar7);
        }
        *(char **)(piVar9 + -2) = __s;
        *piVar9 = (uint)ppVar12->mcolor;
        piVar9 = piVar9 + 6;
        ppVar12 = ppVar12 + 1;
      }
      pnVar3->monsters = pnVar4;
      pnVar3->warnings = warnsyms;
      pnVar3->expltypes = expltypes;
      pnVar3->explsyms = explsyms;
      pnVar3->zaptypes = zaptypes;
      pnVar3->zapsyms = zapsyms;
      pnVar3->breathsyms = breathsyms;
      pnVar3->num_warnings = 6;
      pnVar3->num_expltypes = 7;
      pnVar3->num_zaptypes = 8;
      pnVar3->num_effects = 9;
      pnVar3->effects = effectsyms;
      pnVar3->swallowsyms = swallowsyms;
      pnVar3->bg_feature_offset = 0x19;
      return pnVar3;
    }
    cVar1 = (char)puVar8[2];
    ((nh_symdef *)(piVar9 + -4))->ch = ""[cVar1];
    buffer[0] = '\0';
    local_98 = local_98 & 0xffffffffffffff00;
    buffer[0x28] = '\0';
    puVar11 = (ulong *)((objdescr *)(ppcVar6 + -1))->oc_name;
    if (puVar11 == (ulong *)0x0) {
      unnamed_cnt[cVar1] = unnamed_cnt[cVar1] + 1;
      snprintf((char *)&local_98,0x28,"unnamed %d");
    }
    if (cVar1 == '\r') {
      if ((*puVar8 & 0x1f0) == 0x130) {
        snprintf((char *)&local_98,0x28,"%s glass gem",*ppcVar6);
      }
LAB_00185be1:
      if ((char)local_98 != '\0') {
        puVar11 = &local_98;
      }
switchD_00185c80_caseD_5:
      pcVar7 = "%s";
    }
    else {
      if (cVar1 == '\x05') {
        if ((*puVar8 & 0x1f0) == 0x120) {
          local_98._0_1_ = 'f';
          local_98._1_1_ = 'a';
          local_98._2_1_ = 'k';
          local_98._3_1_ = 'e';
          local_98._4_1_ = ' ';
          local_98._5_1_ = 'a';
          local_98._6_1_ = 'm';
          local_98._7_1_ = 'u';
          uStack_90 = 0x666f2074656c;
          uStack_8a = 0x7920;
          uStack_88 = 0x726f646e65;
        }
        goto LAB_00185be1;
      }
      if ((char)local_98 != '\0') {
        puVar11 = &local_98;
      }
      switch(cVar1) {
      case '\x04':
        pcVar7 = "ring of %s";
        break;
      default:
        goto switchD_00185c80_caseD_5;
      case '\b':
        pcVar7 = "potion of %s";
        break;
      case '\t':
        pcVar7 = "scroll of %s";
        break;
      case '\n':
        pcVar7 = "spellbook of %s";
        break;
      case '\v':
        pcVar7 = "wand of %s";
      }
    }
    snprintf(buffer,0x28,pcVar7,puVar11);
    sVar5 = strlen(buffer);
    pcVar7 = (char *)xmalloc((int)sVar5 + 1);
    strcpy(pcVar7,buffer);
    *(char **)(piVar9 + -2) = pcVar7;
    *piVar9 = (uint)(byte)puVar8[3];
    lVar10 = lVar10 + 1;
    ppcVar6 = ppcVar6 + 2;
    piVar9 = piVar9 + 6;
    puVar8 = puVar8 + 0x14;
  } while( true );
}

Assistant:

struct nh_drawing_info *nh_get_drawing_info(void)
{
    int i;
    struct nh_symdef *tmp;
    struct nh_drawing_info *di = xmalloc(sizeof(struct nh_drawing_info));
    
    di->num_bgelements = SIZE(defsyms);
    di->bgelements = (struct nh_symdef *)defsyms;
    
    di->num_traps = SIZE(trapsyms);
    di->traps = (struct nh_symdef *)trapsyms;
    
    di->num_objects = NUM_OBJECTS;
    tmp = xmalloc(sizeof(struct nh_symdef) * di->num_objects);
    for (i = 0; i < di->num_objects; i++) {
	tmp[i].ch = def_oc_syms[(int)const_objects[i].oc_class];
	tmp[i].symname = make_object_name(i);
	tmp[i].color = const_objects[i].oc_color;
    }
    /* show boulders as '0' by default */
    tmp[BOULDER].ch = '0';
    di->objects = tmp;
    
    tmp = xmalloc(sizeof(struct nh_symdef));
    tmp->ch = DEF_INVISIBLE;
    tmp->color = NO_COLOR;
    tmp->symname = "invisible monster";
    di->invis = tmp;
    
    di->num_monsters = NUMMONS;
    tmp = xmalloc(sizeof(struct nh_symdef) * di->num_monsters);
    for (i = 0; i < di->num_monsters; i++) {
	tmp[i].ch = def_monsyms[(int)mons[i].mlet];
	tmp[i].symname = make_mon_name(i);
	tmp[i].color = mons[i].mcolor;
    }
    di->monsters = tmp;
    
    di->num_warnings = SIZE(warnsyms);
    di->warnings = (struct nh_symdef *)warnsyms;
    
    di->num_expltypes = SIZE(expltypes);
    di->expltypes = (struct nh_symdef *)expltypes;
    di->explsyms = (struct nh_symdef *)explsyms;
    
    di->num_zaptypes = SIZE(zaptypes);
    di->zaptypes = (struct nh_symdef *)zaptypes;
    di->zapsyms = (struct nh_symdef *)zapsyms;
    di->breathsyms = (struct nh_symdef *)breathsyms;
    
    di->num_effects = SIZE(effectsyms);
    di->effects = (struct nh_symdef *)effectsyms;
    
    di->swallowsyms = (struct nh_symdef *)swallowsyms;
    
    di->bg_feature_offset = DUNGEON_FEATURE_OFFSET;
    
    return di;
}